

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O0

void Map_MappingFindLatest(Map_Man_t *p,int *pNodes,int nNodesMax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_2c;
  int local_28;
  int v;
  int k;
  int i;
  int nNodes;
  int nNodesMax_local;
  int *pNodes_local;
  Map_Man_t *p_local;
  
  if (p->nOutputs < nNodesMax) {
    __assert_fail("p->nOutputs >= nNodesMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperUtils.c"
                  ,0x104,"void Map_MappingFindLatest(Map_Man_t *, int *, int)");
  }
  *pNodes = 0;
  k = 1;
  v = 1;
  do {
    iVar3 = k;
    if (p->nOutputs <= v) {
      return;
    }
    do {
      iVar1 = iVar3;
      local_28 = iVar1 + -1;
      if (local_28 < 0) break;
      iVar2 = Map_MappingCompareOutputDelay(p->pOutputs + pNodes[local_28],p->pOutputs + v);
      iVar3 = local_28;
    } while (iVar2 < 0);
    if (local_28 != nNodesMax + -1) {
      iVar3 = k;
      if (k < nNodesMax) {
        iVar3 = k + 1;
        k = iVar3;
      }
      while (local_2c = iVar3 + -1, iVar1 < local_2c) {
        pNodes[local_2c] = pNodes[iVar3 + -2];
        iVar3 = local_2c;
      }
      pNodes[iVar1] = v;
    }
    v = v + 1;
  } while( true );
}

Assistant:

void Map_MappingFindLatest( Map_Man_t * p, int * pNodes, int nNodesMax )
{
    int nNodes, i, k, v;
    assert( p->nOutputs >= nNodesMax );
    pNodes[0] = 0;
    nNodes = 1;
    for ( i = 1; i < p->nOutputs; i++ )
    {
        for ( k = nNodes - 1; k >= 0; k-- )
            if ( Map_MappingCompareOutputDelay( &p->pOutputs[pNodes[k]], &p->pOutputs[i] ) >= 0 )
                break;
        if ( k == nNodesMax - 1 )
            continue;
        if ( nNodes < nNodesMax )
            nNodes++;
        for ( v = nNodes - 1; v > k+1; v-- )
            pNodes[v] = pNodes[v-1];
        pNodes[k+1] = i;
    }
}